

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

bool overlapSC(SoftCluster *c,SoftNode *n)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pSVar4;
  int *piVar5;
  double o_len;
  double alnScore;
  undefined1 local_b0 [8];
  SoftNode cn;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1;
  SoftNode *n_local;
  SoftCluster *c_local;
  
  __end1 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin(&c->nodes);
  cn._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end(&c->nodes);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                                     *)&cn.scAtRight), bVar1) {
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
             ::operator*(&__end1);
    SoftNode::SoftNode((SoftNode *)local_b0,pSVar4);
    iVar2 = n->scPos - local_b0._0_4_;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    if (iVar2 < 6) {
      iVar3 = alignSeq((string *)((long)&cn.refName.field_2 + 8),&n->seq);
      piVar5 = std::min<int>(&n->end,&cn.scPos);
      iVar2 = *piVar5;
      piVar5 = std::max<int>(&n->start,(int *)(local_b0 + 4));
      if ((double)(iVar2 - *piVar5) * 1.0 * 0.9 <= (double)iVar3) {
        bVar1 = false;
      }
      else {
        c_local._7_1_ = 0;
        bVar1 = true;
      }
    }
    else {
      c_local._7_1_ = 0;
      bVar1 = true;
    }
    SoftNode::~SoftNode((SoftNode *)local_b0);
    if (bVar1) goto LAB_0026ef93;
    __gnu_cxx::
    __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
    operator++(&__end1);
  }
  c_local._7_1_ = 1;
LAB_0026ef93:
  return (bool)(c_local._7_1_ & 1);
}

Assistant:

bool overlapSC(const SoftCluster &c, const SoftNode &n)
{
	for (SoftNode cn : c.nodes)
	{
		if (abs(n.scPos - cn.scPos) > MAX_SC_OVERLAP_DISTANCE)
			return false;
		// compare reads in sorted order, first seq should be more towards 5` than second seq
		double alnScore = 1.0 * alignSeq(cn.seq, n.seq);
		double o_len = 1.0 * (std::min(n.end, cn.end) - std::max(n.start, cn.start));
		if (alnScore < ALN_THRESHOLD * o_len)
			return false;
	}
	return true;
}